

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_uuid.cpp
# Opt level: O1

char * ON_UuidToString(ON_UUID *uuid,char *s)

{
  byte bVar1;
  int *piVar2;
  int iVar3;
  endian eVar4;
  ulong uVar5;
  char *pcVar6;
  
  if (ON_UuidToString(ON_UUID_struct_const&,char*)::rho == '\0') {
    iVar3 = __cxa_guard_acquire(&ON_UuidToString(ON_UUID_struct_const&,char*)::rho);
    if (iVar3 != 0) {
      eVar4 = ON::Endian();
      ON_UuidToString::rho = little_endian_rho;
      if (eVar4 == big_endian) {
        ON_UuidToString::rho = big_endian_rho;
      }
      __cxa_guard_release(&ON_UuidToString(ON_UUID_struct_const&,char*)::rho);
    }
  }
  piVar2 = ON_UuidToString::rho;
  if (s == (char *)0x0) {
    s = (char *)0x0;
  }
  else {
    uVar5 = 0;
    pcVar6 = s;
    do {
      bVar1 = uuid->Data4[(long)piVar2[uVar5] + -8];
      *pcVar6 = "0123456789abcdef"[bVar1 >> 4];
      pcVar6[1] = "0123456789abcdef"[bVar1 & 0xf];
      if ((0xfd57UL >> (uVar5 & 0x3f) & 1) == 0) {
        pcVar6[2] = '-';
        pcVar6 = pcVar6 + 3;
      }
      else {
        pcVar6 = pcVar6 + 2;
      }
      uVar5 = uVar5 + 1;
    } while (uVar5 != 0x10);
    *pcVar6 = '\0';
  }
  return s;
}

Assistant:

char* ON_UuidToString( const ON_UUID& uuid, char* s)
{
  // s - [out]  The s[] char array must have length >= 37.  
  //            The returned char array will have a 36 
  //            character uuid in s[0..35] and a null in s[36].

  // NOTE WELL: 
  //   This code has to work on non-Windows OSs and on both big and
  //   little endian CPUs.  The result must satisfy
  //   uuid == ON_UuidFromString(ON_UuidToString(uuid,s))

  // 31 August 2005 Dale Lear
  //     Changed upper case to lower case so result is
  //     identical to the string returned by Windows' ::UuidToString().
  //static const char x[16] = {'0','1','2','3','4','5','6','7','8','9','A','B','C','D','E','F'};
  static const char x[16] = {'0','1','2','3','4','5','6','7','8','9','a','b','c','d','e','f'};
  static const int addhyphen[16] = {0,0,0,1, 0,1, 0,1, 0,1,  0, 0, 0, 0, 0, 0};
  const unsigned char* b = (const unsigned char*)&uuid;
  char* p;
  int i;
  
  static const int* rho = (ON::endian::big_endian == ON::Endian())
                        ? big_endian_rho 
                        : little_endian_rho;

  // 5 December 2002 Dale Lear:
  //   There is either a bug in Purify (likely) or perhaps a bug in the 
  //   way Microsoft compiles  c>>4 when c is an unsigned char.  In any
  //   case, changing c to an unsigned int makes purify happy and should
  //   work just as well.
  //
  //unsigned char c;

  unsigned int c;

  if ( !s )
    return 0;
  p = s;
  for ( i = 0; i < 16; i++ ) {
    c = b[rho[i]];
    *p++ = x[c>>4];  // purify gripes here if c is an unsigned char - the code runs fine.
    *p++ = x[c&0x0F];
    if ( addhyphen[i] )
      *p++ = '-';
  }
  *p = 0;

#if defined(ON_DEBUG)
  {
    ON_UUID u = ON_UuidFromString(s);
    if ( ON_UuidCompare(&u,&uuid) ) {
      ON_ERROR("ON_UuidToString() bug"); // <- breakpoint here
    }
  }
#endif

  return s;
}